

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

void detail::do_deserialize<std::__cxx11::string>(undefined8 *array,long *buffer)

{
  size_t __n;
  
  __n = *(size_t *)*buffer;
  *buffer = (long)((size_t *)*buffer + 1);
  std::__cxx11::string::resize((ulong)array);
  memcpy((void *)*array,(void *)*buffer,__n);
  *buffer = *buffer + __n;
  return;
}

Assistant:

void do_deserialize(T& array, span<std::byte const>& buffer, value_tag<serialization_category::trivial_array>) {
        size_t count;
        deserialize(count, buffer);

        using traits = dynamic_array_traits<T>;
        traits::resize(array, count);

        const auto size = count * sizeof(typename traits::value_type);
        memcpy(traits::data(array), buffer.data(), size);
        buffer.begin() += size;
    }